

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O0

MPP_RET process_subsps(H264_SLICE_t *currSlice)

{
  H264_subSPS_t *cur_subpps;
  bitread_ctx_t *p_bitctx_00;
  h264_subsps_t *phVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  H264_subSPS_t *subset_sps;
  H264_subSPS_t *p_subset;
  H264_subSPS_t *cur_subsps;
  BitReadCtx_t *p_bitctx;
  MPP_RET ret;
  H264_SLICE_t *currSlice_local;
  
  p_bitctx_00 = &currSlice->p_Cur->bitctx;
  uVar2 = 0;
  if (currSlice->p_Cur->subsps == (h264_subsps_t *)0x0) {
    phVar1 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
    currSlice->p_Cur->subsps = phVar1;
  }
  cur_subpps = currSlice->p_Cur->subsps;
  reset_cur_subpps_data(cur_subpps);
  p_bitctx._4_4_ = parser_sps(p_bitctx_00,&cur_subpps->sps,currSlice->p_Dec);
  if (p_bitctx._4_4_ < MPP_OK) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x224,in_R9,uVar2);
    }
  }
  else {
    p_bitctx._4_4_ = parser_subsps_ext(p_bitctx_00,cur_subpps);
    if (MPP_NOK < p_bitctx._4_4_) {
      if ((cur_subpps->sps).Valid != 0) {
        cur_subpps->Valid = 1;
        currSlice->p_Vid->profile_idc = (cur_subpps->sps).profile_idc;
      }
      get_max_dec_frame_buf_size(&cur_subpps->sps);
      if (currSlice->p_Vid->subspsSet[(cur_subpps->sps).seq_parameter_set_id] ==
          (h264_subsps_t *)0x0) {
        phVar1 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
        currSlice->p_Vid->subspsSet[(cur_subpps->sps).seq_parameter_set_id] = phVar1;
      }
      subset_sps = currSlice->p_Vid->subspsSet[(cur_subpps->sps).seq_parameter_set_id];
      if (subset_sps->Valid != 0) {
        recycle_subsps(subset_sps);
      }
      memcpy(subset_sps,cur_subpps,0x10c0);
      return MPP_OK;
    }
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x225,in_R9,uVar2);
    }
  }
  recycle_subsps(currSlice->p_Cur->subsps);
  return p_bitctx._4_4_;
}

Assistant:

MPP_RET process_subsps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    H264_subSPS_t *cur_subsps = NULL;
    H264_subSPS_t *p_subset = NULL;

    if (!currSlice->p_Cur->subsps)
        currSlice->p_Cur->subsps = mpp_calloc(H264_subSPS_t, 1);

    cur_subsps = currSlice->p_Cur->subsps;
    reset_cur_subpps_data(cur_subsps); //reset

    FUN_CHECK(ret = parser_sps(p_bitctx, &cur_subsps->sps, currSlice->p_Dec));
    FUN_CHECK(ret = parser_subsps_ext(p_bitctx, cur_subsps));
    if (cur_subsps->sps.Valid) {
        cur_subsps->Valid = 1;
        currSlice->p_Vid->profile_idc = cur_subsps->sps.profile_idc;
    }
    get_max_dec_frame_buf_size(&cur_subsps->sps);
    //!< make subSPS available
    if (!currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id])
        currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id] = mpp_calloc(H264_subSPS_t, 1);
    p_subset = currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id];
    if (p_subset->Valid) {
        recycle_subsps(p_subset);
    }
    memcpy(p_subset, cur_subsps, sizeof(H264_subSPS_t));

    return ret = MPP_OK;
__FAILED:
    recycle_subsps(currSlice->p_Cur->subsps);

    return ret;
}